

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O2

void google::SafeAppendHexNumber(uint64_t value,char *dest,size_t dest_size)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  char *source;
  undefined8 uStack_28;
  char buf [17];
  
  buf[8] = '\0';
  uStack_28 = 0;
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  lVar3 = 0;
  do {
    lVar4 = lVar3;
    if (lVar4 == 0x10) {
      source = (char *)0x0;
      uStack_28 = uStack_28 & 0xffffffffffffff00;
      goto LAB_0012b974;
    }
    buf[lVar4 + -8] = "0123456789abcdef"[(uint)value & 0xf];
    bVar2 = 0xf < value;
    lVar3 = lVar4 + 1;
    value = value >> 4;
  } while (bVar2);
  pcVar5 = buf + lVar4 + -8;
  buf[lVar4 + -7] = '\0';
  source = (char *)&uStack_28;
  for (pcVar6 = source; pcVar6 < pcVar5; pcVar6 = pcVar6 + 1) {
    cVar1 = *pcVar5;
    *pcVar5 = *pcVar6;
    *pcVar6 = cVar1;
    pcVar5 = pcVar5 + -1;
  }
LAB_0012b974:
  SafeAppendString(source,dest,dest_size);
  return;
}

Assistant:

static void SafeAppendHexNumber(uint64_t value, char* dest, size_t dest_size) {
  // 64-bit numbers in hex can have up to 16 digits.
  char buf[17] = {'\0'};
  SafeAppendString(itoa_r(value, buf, sizeof(buf), 16, 0), dest, dest_size);
}